

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  EdgeDrawing *pEVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  float *pfVar10;
  Scalar_ *in_R8;
  double dVar11;
  _InputArray local_12c8;
  allocator local_12a9;
  string local_12a8 [32];
  _InputArray local_1288;
  allocator local_1269;
  string local_1268 [32];
  _InputArray local_1248;
  allocator local_1229;
  string local_1228 [32];
  _InputArray local_1208;
  allocator local_11e9;
  string local_11e8 [32];
  _OutputArray local_11c8;
  _InputArray local_11b0;
  _InputArray local_1198;
  Mat local_1180 [8];
  Mat diff;
  Scalar_<double> local_1120;
  Point_<double> local_1100;
  Point_ local_10f0 [8];
  Point_<double> local_10e8;
  Point_ local_10d8 [8];
  _InputOutputArray local_10d0;
  int local_10b4;
  undefined1 local_10b0 [4];
  int i;
  Mat local_1090 [8];
  Mat lineImg1;
  undefined1 local_1030 [8];
  Mat lineImg0;
  int local_1024;
  undefined1 local_fd0 [8];
  vector<LS,_std::allocator<LS>_> linesegments;
  undefined1 local_d90 [8];
  EDCircles testEDCircles;
  undefined1 local_880 [8];
  EDLines testEDLines;
  undefined1 local_580 [8];
  ED testED;
  _OutputArray local_340;
  _InputArray local_328;
  _InputArray local_310;
  _InputArray local_2f8;
  Size_<int> local_2e0;
  _OutputArray local_2d8;
  _InputArray local_2c0;
  undefined1 local_2a8 [8];
  vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> lines;
  vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> ellipses;
  Ptr<cv::ximgproc::EdgeDrawing> ed;
  samples local_268 [32];
  VideoCapture local_248 [8];
  VideoCapture capture;
  int local_214;
  undefined1 local_210 [4];
  int counter;
  TickMeter tm1;
  TickMeter tm0;
  Mat gray;
  Mat local_180 [8];
  Mat src;
  allocator local_119;
  string local_118 [38];
  byte local_f2;
  allocator local_f1;
  string local_f0 [6];
  bool show;
  int local_d0;
  allocator local_c9;
  int test_counter;
  double local_a8;
  double scale;
  string local_98 [32];
  CommandLineParser local_78 [8];
  String filename;
  allocator local_41;
  string local_40 [32];
  CommandLineParser local_20 [8];
  CommandLineParser parser;
  char **argv_local;
  int argc_local;
  
  _parser = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"{scale|1|}{counter|99999|}{show|false|}{@filename|vtest.avi|}",&local_41);
  cv::CommandLineParser::CommandLineParser(local_20,argc,argv,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"@filename",(allocator *)((long)&scale + 7));
  cv::CommandLineParser::get<std::__cxx11::string>(local_78,(String *)local_20,SUB81(local_98,0));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&scale + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&test_counter,"scale",&local_c9);
  dVar11 = cv::CommandLineParser::get<double>(local_20,(String *)&test_counter,true);
  std::__cxx11::string::~string((string *)&test_counter);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_a8 = dVar11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"counter",&local_f1);
  iVar4 = cv::CommandLineParser::get<int>(local_20,(String *)local_f0,true);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  local_d0 = iVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"show",&local_119);
  bVar2 = cv::CommandLineParser::get<bool>(local_20,(String *)local_118,true);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_f2 = bVar2;
  cv::Mat::Mat(local_180);
  cv::Mat::Mat((Mat *)&tm0.startTime);
  cv::TickMeter::TickMeter((TickMeter *)&tm1.startTime);
  cv::TickMeter::TickMeter((TickMeter *)local_210);
  local_214 = 0;
  cv::samples::findFileOrKeep(local_268,(String *)local_78,false);
  cv::VideoCapture::VideoCapture(local_248,(string *)local_268,0);
  std::__cxx11::string::~string((string *)local_268);
  bVar3 = cv::VideoCapture::isOpened();
  if ((bVar3 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Capture is opened, ");
    dVar11 = (double)cv::VideoCapture::get((int)local_248);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11);
    poVar5 = std::operator<<(poVar5," frames");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Frame [width,height] : [");
    dVar11 = (double)cv::VideoCapture::get((int)local_248);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11);
    poVar5 = std::operator<<(poVar5,",");
    dVar11 = (double)cv::VideoCapture::get((int)local_248);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11);
    poVar5 = std::operator<<(poVar5,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Scaled[width,height] : [");
    dVar11 = (double)cv::VideoCapture::get((int)local_248);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11 * local_a8);
    poVar5 = std::operator<<(poVar5,",");
    dVar11 = (double)cv::VideoCapture::get((int)local_248);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11 * local_a8);
    poVar5 = std::operator<<(poVar5,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    cv::ximgproc::createEdgeDrawing();
    pEVar6 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                       ((Ptr<cv::ximgproc::EdgeDrawing> *)
                        &ellipses.
                         super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *(undefined4 *)(pEVar6 + 0xc) = 1;
    pEVar6 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                       ((Ptr<cv::ximgproc::EdgeDrawing> *)
                        &ellipses.
                         super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *(undefined4 *)(pEVar6 + 0x10) = 0x24;
    pEVar6 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                       ((Ptr<cv::ximgproc::EdgeDrawing> *)
                        &ellipses.
                         super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *(undefined4 *)(pEVar6 + 0x14) = 8;
    pEVar6 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                       ((Ptr<cv::ximgproc::EdgeDrawing> *)
                        &ellipses.
                         super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *(undefined4 *)(pEVar6 + 0x18) = 1;
    std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::vector
              ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
               &lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::vector
              ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)local_2a8);
    while( true ) {
      iVar4 = (int)in_R8;
      cv::VideoCapture::operator>>(local_248,local_180);
      local_d0 = local_d0 + -1;
      bVar3 = cv::Mat::empty();
      if (((bVar3 & 1) != 0) || (local_d0 < 0)) break;
      cv::_InputArray::_InputArray(&local_2c0,local_180);
      cv::_OutputArray::_OutputArray(&local_2d8,local_180);
      cv::Size_<int>::Size_(&local_2e0);
      cv::resize(local_a8,&local_2c0,&local_2d8,&local_2e0);
      cv::_OutputArray::~_OutputArray(&local_2d8);
      cv::_InputArray::~_InputArray(&local_2c0);
      cv::_InputArray::_InputArray(&local_2f8,local_180);
      cv::_OutputArray::_OutputArray((_OutputArray *)&local_310,(Mat *)&tm0.startTime);
      cv::cvtColor((cv *)&local_2f8,&local_310,(_OutputArray *)0x6,0,iVar4);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&local_310);
      cv::_InputArray::~_InputArray(&local_2f8);
      cv::TickMeter::start((TickMeter *)&tm1.startTime);
      pEVar6 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                         ((Ptr<cv::ximgproc::EdgeDrawing> *)
                          &ellipses.
                           super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_InputArray::_InputArray(&local_328,(Mat *)&tm0.startTime);
      (**(code **)(*(long *)pEVar6 + 0x40))(pEVar6,&local_328);
      cv::_InputArray::~_InputArray(&local_328);
      pEVar6 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                         ((Ptr<cv::ximgproc::EdgeDrawing> *)
                          &ellipses.
                           super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::_OutputArray<cv::Vec<float,4>>
                (&local_340,
                 (vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)local_2a8);
      (**(code **)(*(long *)pEVar6 + 0x60))(pEVar6,&local_340);
      cv::_OutputArray::~_OutputArray(&local_340);
      pEVar6 = cv::Ptr<cv::ximgproc::EdgeDrawing>::operator->
                         ((Ptr<cv::ximgproc::EdgeDrawing> *)
                          &ellipses.
                           super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::_OutputArray<cv::Vec<double,6>>
                ((_OutputArray *)&testED.sumFlag,
                 (vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
                 &lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      (**(code **)(*(long *)pEVar6 + 0x68))(pEVar6,&testED.sumFlag);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&testED.sumFlag);
      cv::TickMeter::stop((TickMeter *)&tm1.startTime);
      local_214 = local_214 + 1;
      cv::TickMeter::start((TickMeter *)local_210);
      cv::Mat::Mat((Mat *)&testEDLines.nfa,(Mat *)&tm0.startTime);
      in_R8 = (Scalar_ *)0x8;
      ED::ED((ED *)local_580,(Mat *)&testEDLines.nfa,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
      cv::Mat::~Mat((Mat *)&testEDLines.nfa);
      ED::ED((ED *)&testEDCircles.nfa,(ED *)local_580);
      EDLines::EDLines((EDLines *)local_880,(ED *)&testEDCircles.nfa,1.0,-1,6.0,1.3);
      ED::~ED((ED *)&testEDCircles.nfa);
      ED::ED((ED *)&linesegments.super__Vector_base<LS,_std::allocator<LS>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ED *)local_880);
      EDCircles::EDCircles
                ((EDCircles *)local_d90,
                 (ED *)&linesegments.super__Vector_base<LS,_std::allocator<LS>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      ED::~ED((ED *)&linesegments.super__Vector_base<LS,_std::allocator<LS>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      cv::TickMeter::stop((TickMeter *)local_210);
      if ((local_f2 & 1) != 0) {
        EDLines::getLines((vector<LS,_std::allocator<LS>_> *)local_fd0,(EDLines *)local_880);
        EDLines::getLineImage((EDLines *)local_1030);
        iVar4 = _lineImg0;
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_10b0,255.0);
        in_R8 = (Scalar_ *)local_10b0;
        cv::Mat::Mat(local_1090,iVar4,local_1024,0,in_R8);
        for (local_10b4 = 0; uVar7 = (ulong)local_10b4,
            sVar8 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::size
                              ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                               local_2a8), uVar7 < sVar8; local_10b4 = local_10b4 + 1) {
          cv::_InputOutputArray::_InputOutputArray(&local_10d0,local_1090);
          pvVar9 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                             ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                              local_2a8,(long)local_10b4);
          pfVar10 = cv::Vec<float,_4>::operator[](pvVar9,0);
          fVar1 = *pfVar10;
          pvVar9 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                             ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                              local_2a8,(long)local_10b4);
          pfVar10 = cv::Vec<float,_4>::operator[](pvVar9,1);
          cv::Point_<double>::Point_(&local_10e8,(double)fVar1,(double)*pfVar10);
          cv::Point_::operator_cast_to_Point_(local_10d8);
          pvVar9 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                             ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                              local_2a8,(long)local_10b4);
          pfVar10 = cv::Vec<float,_4>::operator[](pvVar9,2);
          fVar1 = *pfVar10;
          pvVar9 = std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::operator[]
                             ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)
                              local_2a8,(long)local_10b4);
          pfVar10 = cv::Vec<float,_4>::operator[](pvVar9,3);
          cv::Point_<double>::Point_(&local_1100,(double)fVar1,(double)*pfVar10);
          cv::Point_::operator_cast_to_Point_(local_10f0);
          cv::Scalar_<double>::Scalar_(&local_1120,0.0);
          in_R8 = (Scalar_ *)0x1;
          cv::line(&local_10d0,local_10d8,local_10f0,&local_1120,1,0x10,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_10d0);
        }
        cv::Mat::Mat(local_1180);
        cv::_InputArray::_InputArray(&local_1198,(Mat *)local_1030);
        cv::_InputArray::_InputArray(&local_11b0,local_1090);
        cv::_OutputArray::_OutputArray(&local_11c8,local_1180);
        cv::absdiff(&local_1198,&local_11b0,&local_11c8);
        cv::_OutputArray::~_OutputArray(&local_11c8);
        cv::_InputArray::~_InputArray(&local_11b0);
        cv::_InputArray::~_InputArray(&local_1198);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_11e8,"lineImg0",&local_11e9);
        cv::_InputArray::_InputArray(&local_1208,(Mat *)local_1030);
        cv::imshow(local_11e8,&local_1208);
        cv::_InputArray::~_InputArray(&local_1208);
        std::__cxx11::string::~string(local_11e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1228,"lineImg1",&local_1229);
        cv::_InputArray::_InputArray(&local_1248,local_1090);
        cv::imshow(local_1228,&local_1248);
        cv::_InputArray::~_InputArray(&local_1248);
        std::__cxx11::string::~string(local_1228);
        std::allocator<char>::~allocator((allocator<char> *)&local_1229);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1268,"diff",&local_1269);
        cv::_InputArray::_InputArray(&local_1288,local_1180);
        cv::imshow(local_1268,&local_1288);
        cv::_InputArray::~_InputArray(&local_1288);
        std::__cxx11::string::~string(local_1268);
        std::allocator<char>::~allocator((allocator<char> *)&local_1269);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_12a8,"gray",&local_12a9);
        cv::_InputArray::_InputArray(&local_12c8,(Mat *)&tm0.startTime);
        cv::imshow(local_12a8,&local_12c8);
        cv::_InputArray::~_InputArray(&local_12c8);
        std::__cxx11::string::~string(local_12a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_12a9);
        cv::waitKey(0);
        cv::Mat::~Mat(local_1180);
        cv::Mat::~Mat(local_1090);
        cv::Mat::~Mat((Mat *)local_1030);
        std::vector<LS,_std::allocator<LS>_>::~vector((vector<LS,_std::allocator<LS>_> *)local_fd0);
      }
      EDCircles::~EDCircles((EDCircles *)local_d90);
      EDLines::~EDLines((EDLines *)local_880);
      ED::~ED((ED *)local_580);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"OpenCV    processed ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_214);
    poVar5 = std::operator<<(poVar5," frames in    ");
    dVar11 = cv::TickMeter::getTimeMilli((TickMeter *)&tm1.startTime);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11);
    std::operator<<(poVar5," ms.");
    poVar5 = std::operator<<((ostream *)&std::cout,"\t\tfps : ");
    dVar11 = cv::TickMeter::getTimeMilli((TickMeter *)&tm1.startTime);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)(local_214 * 1000) / dVar11);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"EDCircles processed ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_214);
    poVar5 = std::operator<<(poVar5," frames in    ");
    dVar11 = cv::TickMeter::getTimeMilli((TickMeter *)local_210);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11);
    std::operator<<(poVar5," ms.");
    poVar5 = std::operator<<((ostream *)&std::cout,"\t\tfps : ");
    dVar11 = cv::TickMeter::getTimeMilli((TickMeter *)local_210);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)(local_214 * 1000) / dVar11);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>::~vector
              ((vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> *)local_2a8);
    std::vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>::~vector
              ((vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> *)
               &lines.super__Vector_base<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::Ptr<cv::ximgproc::EdgeDrawing>::~Ptr
              ((Ptr<cv::ximgproc::EdgeDrawing> *)
               &ellipses.
                super__Vector_base<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  }
  cv::VideoCapture::~VideoCapture(local_248);
  cv::Mat::~Mat((Mat *)&tm0.startTime);
  cv::Mat::~Mat(local_180);
  std::__cxx11::string::~string((string *)local_78);
  cv::CommandLineParser::~CommandLineParser(local_20);
  return 0;
}

Assistant:

int main(int argc, const char** argv)
{
    cv::CommandLineParser parser(argc, argv,
        "{scale|1|}"
        "{counter|99999|}"
        "{show|false|}"
        "{@filename|vtest.avi|}"
    );

    String filename = parser.get<string>("@filename");
    double scale = parser.get<double>("scale");
    int test_counter = parser.get<int>("counter");
    bool show = parser.get<bool>("show");
    Mat src, gray;
    TickMeter tm0, tm1;
    int counter = 0;

    VideoCapture capture(samples::findFileOrKeep(filename));
    if (capture.isOpened())
    {
        cout << "Capture is opened, " << capture.get(CAP_PROP_FRAME_COUNT) << " frames" << endl;
        cout << "Frame [width,height] : ["  << capture.get(CAP_PROP_FRAME_WIDTH) << "," << capture.get(CAP_PROP_FRAME_HEIGHT) << "]" << endl;
        cout << "Scaled[width,height] : [" << capture.get(CAP_PROP_FRAME_WIDTH) * scale << "," << capture.get(CAP_PROP_FRAME_HEIGHT) * scale << "]" << endl;;

        Ptr<EdgeDrawing> ed = createEdgeDrawing();
        ed->params.EdgeDetectionOperator = EdgeDrawing::SOBEL;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 8;
        ed->params.ScanInterval = 1;
        vector<Vec6d> ellipses;
        vector<Vec4f> lines;

        for (;;)
        {
            capture >> src;
            test_counter--;

            if (src.empty() || test_counter < 0)
                break;

            resize(src, src, Size(), scale, scale);
            cvtColor(src, gray, COLOR_BGR2GRAY);

            tm0.start();
            ed->detectEdges(gray);
            ed->detectLines(lines);
            ed->detectEllipses(ellipses);
            tm0.stop();
            counter++;

            tm1.start();
            ED testED = ED(gray, SOBEL_OPERATOR, 36, 8, 1, 10, 1.0, true);
            EDLines testEDLines = EDLines(testED);
            EDCircles testEDCircles = EDCircles(testEDLines);
            tm1.stop();

            if (show)
            {
                std::vector<LS> linesegments = testEDLines.getLines();

                Mat lineImg0 = testEDLines.getLineImage();    //draws on an empty image
                Mat lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

                for (int i = 0; i < lines.size(); i++)
                    line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

                Mat diff;
                absdiff(lineImg0, lineImg1, diff);
                imshow("lineImg0", lineImg0);
                imshow("lineImg1", lineImg1);
                imshow("diff", diff);
                imshow("gray", gray);
                waitKey();
            }
        }

        cout << "OpenCV    processed " << counter << " frames in    " << tm0.getTimeMilli() << " ms.";
        cout << "\t\tfps : " << counter * 1000 / tm0.getTimeMilli() << endl;

        cout << "EDCircles processed " << counter << " frames in    " << tm1.getTimeMilli() << " ms.";
        cout << "\t\tfps : " << counter * 1000 / tm1.getTimeMilli() << endl;
    }
    return 0;
}